

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

string * anon_unknown.dwarf_d849::cpputf8_u16_to_u8(string *__return_storage_ptr__,u16string *u16)

{
  const_iterator start;
  const_iterator end;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  u16string *u16_local;
  string *u8;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  start = std::begin<std::__cxx11::u16string>(u16);
  end = std::end<std::__cxx11::u16string>(u16);
  result = std::back_inserter<std::__cxx11::string>(__return_storage_ptr__);
  utf8::
  utf16to8<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,std::back_insert_iterator<std::__cxx11::string>>
            ((__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )start._M_current,
             (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
              )end._M_current,result);
  return __return_storage_ptr__;
}

Assistant:

inline
string cpputf8_u16_to_u8(const u16string& u16)
{
    string u8;
    utf8::utf16to8(std::begin(u16), std::end(u16), std::back_inserter(u8));
    return u8;
}